

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O0

LocalizedNumberFormatter * __thiscall
icu_63::number::LocalizedNumberFormatter::operator=(LocalizedNumberFormatter *this,LNF *other)

{
  LNF *other_local;
  LocalizedNumberFormatter *this_local;
  
  NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>::operator=
            (&this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>,
             &other->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>);
  clear(this);
  return this;
}

Assistant:

LocalizedNumberFormatter& LocalizedNumberFormatter::operator=(const LNF& other) {
    NFS<LNF>::operator=(static_cast<const NFS<LNF>&>(other));
    // Reset to default values.
    clear();
    return *this;
}